

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

State __thiscall QAccessibleTextEdit::state(QAccessibleTextEdit *this)

{
  long lVar1;
  bool bVar2;
  State SVar3;
  QAccessibleTextWidget *in_RDI;
  long in_FS_OFFSET;
  State st;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar3 = QAccessibleTextWidget::state(in_RDI);
  local_10._0_5_ = SVar3._0_5_;
  local_10 = (State)CONCAT35(0xaaaaaa,(undefined5)local_10);
  textEdit((QAccessibleTextEdit *)0x7e3cc1);
  bVar2 = QTextEdit::isReadOnly((QTextEdit *)in_RDI);
  if (bVar2) {
    local_10 = (State)((ulong)local_10 & 0xfffffffffffffeff | 0x100);
  }
  else {
    local_10 = (State)(CONCAT35(0xaaaaaa,(undefined5)local_10) & 0xfffffffeffffffff | 0x100000000);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QAccessible::State QAccessibleTextEdit::state() const
{
    QAccessible::State st = QAccessibleTextWidget::state();
    if (textEdit()->isReadOnly())
        st.readOnly = true;
    else
        st.editable = true;
    return st;
}